

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

Iterator * __thiscall
kj::_::BTreeImpl::search(Iterator *__return_storage_ptr__,BTreeImpl *this,SearchKey *searchKey)

{
  NodeUnion *pNVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Leaf *pLVar5;
  
  uVar4 = 0;
  for (uVar3 = this->height; uVar3 != 0; uVar3 = uVar3 - 1) {
    pNVar1 = this->tree;
    uVar2 = (**searchKey->_vptr_SearchKey)(searchKey,pNVar1 + uVar4);
    uVar4 = (ulong)*(uint *)((long)&pNVar1[uVar4].field_0 + (ulong)uVar2 * 4 + 0x20);
  }
  pNVar1 = this->tree;
  pLVar5 = (Leaf *)(pNVar1 + uVar4);
  uVar3 = (*searchKey->_vptr_SearchKey[1])(searchKey,pLVar5);
  __return_storage_ptr__->tree = pNVar1;
  __return_storage_ptr__->leaf = pLVar5;
  __return_storage_ptr__->row = uVar3;
  return __return_storage_ptr__;
}

Assistant:

BTreeImpl::Iterator BTreeImpl::search(const SearchKey& searchKey) const {
  // Find the "first" row number (in sorted order) for which searchKey.isAfter(rowNumber) returns
  // false.

  uint pos = 0;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    auto& parent = tree[pos].parent;
    pos = parent.children[searchKey.search(parent)];
  }

  auto& leaf = tree[pos].leaf;
  return { tree, &leaf, searchKey.search(leaf) };
}